

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86_avx::forward_inplace(BinaryOp_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int op_type;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *ptr;
  ulong uVar5;
  ulong uVar6;
  float local_34;
  
  op_type = (this->super_BinaryOp).op_type;
  iVar1 = bottom_top_blob->h;
  iVar2 = bottom_top_blob->w;
  iVar3 = bottom_top_blob->d;
  iVar4 = bottom_top_blob->elempack;
  uVar6 = 0;
  uVar5 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    ptr = (float *)(bottom_top_blob->cstep * uVar6 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
    binary_op_vector(ptr,&local_34,ptr,iVar1 * iVar2 * iVar3 * iVar4,1,1,1,op_type);
  }
  return 0;
}

Assistant:

int BinaryOp_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    binary_op_scalar_inplace(bottom_top_blob, b, op_type, opt);

    return 0;
}